

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAigerExt.c
# Opt level: O2

Vec_Int_t * Gia_AigerReadPacking(uchar **ppPos,int nSize)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  int *__ptr;
  uint uVar3;
  ulong uVar4;
  uchar *pPos;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  uint local_38;
  
  uVar8 = (long)nSize / 4 & 0xffffffff;
  pVVar2 = (Vec_Int_t *)malloc(0x10);
  iVar1 = (int)((long)nSize / 4);
  uVar4 = uVar8;
  if (iVar1 - 1U < 0xf) {
    uVar4 = 0x10;
  }
  pVVar2->nSize = 0;
  iVar6 = (int)uVar4;
  pVVar2->nCap = iVar6;
  if (iVar6 == 0) {
    __ptr = (int *)0x0;
  }
  else {
    __ptr = (int *)malloc((long)iVar6 << 2);
  }
  pVVar2->pArray = __ptr;
  if ((nSize & 3U) == 0) {
    uVar5 = 0;
    if (iVar1 < 1) {
      uVar8 = uVar5;
    }
    do {
      local_38 = (uint)uVar8;
      if (local_38 == (uint)uVar5) {
        return pVVar2;
      }
      pPos = *ppPos;
      iVar1 = Gia_AigerReadInt(pPos);
      uVar7 = (uint)uVar4;
      if ((uint)uVar5 == uVar7) {
        uVar4 = (ulong)(uVar7 * 2);
        if ((int)uVar7 < 0x10) {
          uVar4 = 0x10;
        }
        uVar3 = (uint)uVar4;
        if ((int)uVar7 < (int)uVar3) {
          if (__ptr == (int *)0x0) {
            __ptr = (int *)malloc(uVar4 << 2);
          }
          else {
            __ptr = (int *)realloc(__ptr,uVar4 << 2);
          }
          pVVar2->pArray = __ptr;
          if (__ptr == (int *)0x0) {
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
          }
          pVVar2->nCap = uVar3;
          pPos = *ppPos;
          uVar7 = uVar3;
        }
      }
      pVVar2->nSize = (int)(uVar5 + 1);
      __ptr[uVar5] = iVar1;
      *ppPos = pPos + 4;
      uVar4 = (ulong)uVar7;
      uVar5 = uVar5 + 1;
    } while( true );
  }
  __assert_fail("nSize % 4 == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaAigerExt.c"
                ,0x132,"Vec_Int_t *Gia_AigerReadPacking(unsigned char **, int)");
}

Assistant:

Vec_Int_t * Gia_AigerReadPacking( unsigned char ** ppPos, int nSize )
{
    Vec_Int_t * vPacking = Vec_IntAlloc( nSize/4 );
    int i;
    assert( nSize % 4 == 0 );
    for ( i = 0; i < nSize/4; i++, *ppPos += 4 )
        Vec_IntPush( vPacking, Gia_AigerReadInt( *ppPos ) );
    return vPacking;
}